

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::BayesianProbitRegressor::~BayesianProbitRegressor
          (BayesianProbitRegressor *this)

{
  ~BayesianProbitRegressor(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

BayesianProbitRegressor::~BayesianProbitRegressor() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.BayesianProbitRegressor)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}